

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

string * __thiscall
t_js_generator::render_includes_abi_cxx11_(string *__return_storage_ptr__,t_js_generator *this)

{
  bool bVar1;
  vector<t_program_*,_std::allocator<t_program_*>_> *this_00;
  reference pptVar2;
  string *name;
  size_type sVar3;
  string local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  t_program *local_58;
  t_program *include;
  const_iterator __end2;
  const_iterator __begin2;
  vector<t_program_*,_std::allocator<t_program_*>_> *__range2;
  vector<t_program_*,_std::allocator<t_program_*>_> *includes;
  allocator local_1a;
  undefined1 local_19;
  t_js_generator *local_18;
  t_js_generator *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (t_js_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  if ((this->gen_node_ & 1U) != 0) {
    this_00 = t_program::get_includes((this->super_t_oop_generator).super_t_generator.program_);
    __end2 = std::vector<t_program_*,_std::allocator<t_program_*>_>::begin(this_00);
    include = (t_program *)std::vector<t_program_*,_std::allocator<t_program_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                                       *)&include), bVar1) {
      pptVar2 = __gnu_cxx::
                __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
                ::operator*(&__end2);
      local_58 = *pptVar2;
      name = t_program::get_name_abi_cxx11_(local_58);
      make_valid_nodeJs_identifier(&local_f8,this,name);
      std::operator+(&local_d8,&this->js_const_type_,&local_f8);
      std::operator+(&local_b8,&local_d8,"_ttypes = require(\'");
      get_import_path_abi_cxx11_(&local_118,this,local_58);
      std::operator+(&local_98,&local_b8,&local_118);
      std::operator+(&local_78,&local_98,"\');\n");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      __gnu_cxx::
      __normal_iterator<t_program_*const_*,_std::vector<t_program_*,_std::allocator<t_program_*>_>_>
      ::operator++(&__end2);
    }
    sVar3 = std::vector<t_program_*,_std::allocator<t_program_*>_>::size(this_00);
    if (sVar3 != 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_js_generator::render_includes() {
  string result = "";

  if (gen_node_) {
    const vector<t_program*>& includes = program_->get_includes();
    for (auto include : includes) {
      result += js_const_type_ + make_valid_nodeJs_identifier(include->get_name()) + "_ttypes = require('" + get_import_path(include) + "');\n";
    }
    if (includes.size() > 0) {
      result += "\n";
    }
  }

  return result;
}